

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O1

void __thiscall
chrono::robosimian::RS_Part::SetVisualizationType(RS_Part *this,VisualizationType vis)

{
  undefined8 local_30;
  undefined8 local_28;
  
  chrono::ChPhysicsItem::GetVisualModel();
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_30 != 0) {
    chrono::ChPhysicsItem::GetVisualModel();
    chrono::ChVisualModel::Clear();
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
  }
  AddVisualizationAssets(this,vis);
  return;
}

Assistant:

void RS_Part::SetVisualizationType(VisualizationType vis) {
    if (m_body->GetVisualModel())
        m_body->GetVisualModel()->Clear();

    AddVisualizationAssets(vis);
}